

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

FILE * find_in_path(char *name,char *path,char **pfullname)

{
  char *pcVar1;
  size_t sVar2;
  char *__dest;
  FILE *pFVar3;
  size_t __n;
  bool bVar4;
  FILE *local_40;
  
  if (path == (char *)0x0) {
LAB_00108282:
    local_40 = (FILE *)0x0;
  }
  else {
    do {
      if (path == (char *)0x0) goto LAB_00108282;
      pcVar1 = strchr(path,0x3a);
      if (pcVar1 == (char *)0x0) {
        __n = strlen(path);
        pcVar1 = (char *)0x0;
      }
      else {
        __n = (long)pcVar1 - (long)path;
        pcVar1 = pcVar1 + 1;
      }
      if (__n == 0) {
        bVar4 = true;
        path = pcVar1;
      }
      else {
        sVar2 = strlen(name);
        __dest = (char *)malloc(sVar2 + __n + 2);
        strncpy(__dest,path,__n);
        (__dest + __n)[0] = '/';
        (__dest + __n)[1] = '\0';
        strcat(__dest,name);
        pFVar3 = fopen(__dest,"r");
        bVar4 = pFVar3 == (FILE *)0x0;
        if (bVar4) {
          free(__dest);
          path = pcVar1;
        }
        else {
          local_40 = pFVar3;
          if (pfullname == (char **)0x0) {
            free(__dest);
          }
          else {
            *pfullname = __dest;
          }
        }
      }
    } while (bVar4);
  }
  return (FILE *)local_40;
}

Assistant:

FILE *find_in_path(const char *name, const char *path, char **pfullname) {
	if (!path)
		return 0;
	while (path) {
		const char *npath = strchr(path, ':');
		size_t plen;
		if (npath) {
			plen = npath - path;
			npath++;
		} else {
			plen = strlen(path);
		}
		if (plen) {
			char *fullname = malloc(strlen(name) + plen + 2);
			strncpy(fullname, path, plen);
			fullname[plen] = '/';
			fullname[plen+1] = 0;
			strcat(fullname, name);
			FILE *file = fopen(fullname, "r");
			if (file) {
				if (pfullname)
					*pfullname = fullname;
				else
					free(fullname);
				return file;
			}
			free(fullname);
		}
		path = npath;
	}
	return 0;
}